

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Adjuster.cxx
# Opt level: O2

void __thiscall Fl_Adjuster::draw(Fl_Adjuster *this)

{
  int H;
  int W;
  int iVar1;
  Fl_Color c;
  int iVar2;
  Fl_Boxtype FVar3;
  int iVar4;
  int iVar5;
  
  W = (this->super_Fl_Valuator).super_Fl_Widget.w_;
  H = (this->super_Fl_Valuator).super_Fl_Widget.h_;
  if (W < H) {
    H = H / 3;
    iVar4 = H;
    iVar5 = 0;
  }
  else {
    W = W / 3;
    iVar4 = 0;
    iVar5 = W;
  }
  FVar3 = (uint)(this->super_Fl_Valuator).super_Fl_Widget.box_;
  if (*(int *)&(this->super_Fl_Valuator).field_0xa4 == 1) {
    FVar3 = FL_DOWN_BOX;
  }
  Fl_Widget::draw_box((Fl_Widget *)this,FVar3,(this->super_Fl_Valuator).super_Fl_Widget.x_,
                      (this->super_Fl_Valuator).super_Fl_Widget.y_ + iVar4 * 2,W,H,
                      (this->super_Fl_Valuator).super_Fl_Widget.color_);
  FVar3 = (Fl_Boxtype)(this->super_Fl_Valuator).super_Fl_Widget.box_;
  if (*(int *)&(this->super_Fl_Valuator).field_0xa4 == 2) {
    FVar3 = FL_DOWN_BOX;
  }
  Fl_Widget::draw_box((Fl_Widget *)this,FVar3,(this->super_Fl_Valuator).super_Fl_Widget.x_ + iVar5,
                      (this->super_Fl_Valuator).super_Fl_Widget.y_ + iVar4,W,H,
                      (this->super_Fl_Valuator).super_Fl_Widget.color_);
  FVar3 = (Fl_Boxtype)(this->super_Fl_Valuator).super_Fl_Widget.box_;
  if (*(int *)&(this->super_Fl_Valuator).field_0xa4 == 3) {
    FVar3 = FL_DOWN_BOX;
  }
  Fl_Widget::draw_box((Fl_Widget *)this,FVar3,
                      (this->super_Fl_Valuator).super_Fl_Widget.x_ + iVar5 * 2,
                      (this->super_Fl_Valuator).super_Fl_Widget.y_,W,H,
                      (this->super_Fl_Valuator).super_Fl_Widget.color_);
  iVar1 = Fl_Widget::active_r((Fl_Widget *)this);
  c = (this->super_Fl_Valuator).super_Fl_Widget.color2_;
  if (iVar1 == 0) {
    c = fl_inactive(c);
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)c);
  iVar1 = (W + -0x10) / 2;
  iVar2 = (H + -0x10) / 2;
  Fl_Bitmap::draw(&fastarrow,(this->super_Fl_Valuator).super_Fl_Widget.x_ + iVar1,
                  iVar4 * 2 + iVar2 + (this->super_Fl_Valuator).super_Fl_Widget.y_,W,H,0,0);
  Fl_Bitmap::draw(&mediumarrow,iVar5 + iVar1 + (this->super_Fl_Valuator).super_Fl_Widget.x_,
                  iVar4 + iVar2 + (this->super_Fl_Valuator).super_Fl_Widget.y_,W,H,0,0);
  Fl_Bitmap::draw(&slowarrow,iVar5 * 2 + iVar1 + (this->super_Fl_Valuator).super_Fl_Widget.x_,
                  iVar2 + (this->super_Fl_Valuator).super_Fl_Widget.y_,W,H,0,0);
  if ((Fl_Adjuster *)Fl::focus_ != this) {
    return;
  }
  Fl_Widget::draw_focus((Fl_Widget *)this);
  return;
}

Assistant:

void Fl_Adjuster::draw() {
  int dx, dy, W, H;
  if (w()>=h()) {
    dx = W = w()/3;
    dy = 0; H = h();
  } else {
    dx = 0; W = w();
    dy = H = h()/3;
  }
  draw_box(drag==1?FL_DOWN_BOX:box(), x(),  y()+2*dy, W, H, color());
  draw_box(drag==2?FL_DOWN_BOX:box(), x()+dx, y()+dy, W, H, color());
  draw_box(drag==3?FL_DOWN_BOX:box(), x()+2*dx,  y(), W, H, color());
  if (active_r())
    fl_color(selection_color());
  else
    fl_color(fl_inactive(selection_color()));
  fastarrow.draw(x()+(W-fastarrow_width)/2,
		 y()+2*dy+(H-fastarrow_height)/2, W, H);
  mediumarrow.draw(x()+dx+(W-mediumarrow_width)/2,
		   y()+dy+(H-mediumarrow_height)/2, W, H);
  slowarrow.draw(x()+2*dx+(W-slowarrow_width)/2,
		 y()+(H-slowarrow_width)/2, W, H);
  if (Fl::focus() == this) draw_focus();
}